

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int transfer_get_message_format(TRANSFER_HANDLE transfer,message_format *message_format_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  TRANSFER_INSTANCE *transfer_instance;
  uint32_t item_count;
  int result;
  message_format *message_format_value_local;
  TRANSFER_HANDLE transfer_local;
  
  if (transfer == (TRANSFER_HANDLE)0x0) {
    transfer_instance._4_4_ = 0x1d61;
  }
  else {
    _item_count = message_format_value;
    message_format_value_local = (message_format *)transfer;
    iVar1 = amqpvalue_get_composite_item_count
                      (transfer->composite_value,(uint32_t *)&transfer_instance);
    if (iVar1 == 0) {
      if ((uint)transfer_instance < 4) {
        transfer_instance._4_4_ = 0x1d6f;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(transfer->composite_value,3);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          transfer_instance._4_4_ = 0x1d77;
        }
        else {
          iVar1 = amqpvalue_get_uint(value,_item_count);
          if (iVar1 == 0) {
            transfer_instance._4_4_ = 0;
          }
          else {
            transfer_instance._4_4_ = 0x1d7e;
          }
        }
      }
    }
    else {
      transfer_instance._4_4_ = 0x1d69;
    }
  }
  return transfer_instance._4_4_;
}

Assistant:

int transfer_get_message_format(TRANSFER_HANDLE transfer, message_format* message_format_value)
{
    int result;

    if (transfer == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        TRANSFER_INSTANCE* transfer_instance = (TRANSFER_INSTANCE*)transfer;
        if (amqpvalue_get_composite_item_count(transfer_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 3)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(transfer_instance->composite_value, 3);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_message_format(item_value, message_format_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}